

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffphbn(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  FITSfile *pFVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long value;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  long repeat;
  long width;
  char name [75];
  char card [81];
  char extnm [71];
  char tfmt [30];
  uint local_1dc;
  char local_1d8 [16];
  undefined8 uStack_1c8;
  undefined5 uStack_1c0;
  undefined2 uStack_1bb;
  undefined1 uStack_1b9;
  undefined7 uStack_1b8;
  undefined1 uStack_1b1;
  undefined7 uStack_1b0;
  undefined1 uStack_1a9;
  long local_188;
  char **local_180;
  char **local_178;
  char **local_170;
  long local_168;
  ulong local_160;
  char local_158 [80];
  char local_108 [4];
  undefined2 auStack_104 [2];
  char local_100 [8];
  char acStack_f8 [8];
  char acStack_f0 [8];
  char acStack_e8 [8];
  char acStack_e0 [6];
  undefined8 auStack_da [6];
  char local_a8 [80];
  char local_58 [40];
  
  iVar11 = *status;
  if (iVar11 < 1) {
    local_178 = ttype;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar1 = fptr->Fptr;
    if (pFVar1->headend == pFVar1->headstart[pFVar1->curhdu]) {
      if (naxis2 < 0) {
        *status = 0xda;
        iVar11 = 0xda;
      }
      else if (pcount < 0) {
        *status = 0xd6;
        iVar11 = 0xd6;
      }
      else if ((uint)tfields < 1000) {
        local_a8[0] = '\0';
        if (extnmx != (char *)0x0) {
          strncat(local_a8,extnmx,0x46);
        }
        local_180 = tunit;
        local_170 = tform;
        ffpkys(fptr,"XTENSION","BINTABLE","binary table extension",status);
        ffpkyj(fptr,"BITPIX",8,"8-bit bytes",status);
        ffpkyj(fptr,"NAXIS",2,"2-dimensional binary table",status);
        if (tfields == 0) {
          value = 0;
        }
        else {
          uVar9 = 1;
          if (1 < tfields) {
            uVar9 = (ulong)(uint)tfields;
          }
          value = 0;
          lVar8 = 0;
          do {
            ffbnfm(local_170[lVar8],(int *)&local_1dc,&local_188,&local_168,status);
            if (local_1dc == 1) {
              lVar4 = local_188 + 0xe;
              if (-1 < local_188 + 7) {
                lVar4 = local_188 + 7;
              }
              lVar4 = lVar4 >> 3;
            }
            else {
              lVar4 = local_188;
              if (local_1dc != 0x10) {
                if ((int)local_1dc < 1) {
                  lVar4 = 8;
                  if ((byte)(*local_170[lVar8] | 0x20U) != 0x70) {
                    lVar4 = (ulong)((local_170[lVar8][1] + 0xb0U & 0xdf) != 0) * 8 + 8;
                  }
                }
                else {
                  lVar4 = ((ulong)local_1dc / 10) * local_188;
                }
              }
            }
            value = value + lVar4;
          } while ((*status < 1) && (bVar12 = uVar9 - 1 != lVar8, lVar8 = lVar8 + 1, bVar12));
        }
        ffpkyj(fptr,"NAXIS1",value,"width of table in bytes",status);
        ffpkyj(fptr,"NAXIS2",naxis2,"number of rows in table",status);
        ffpkyj(fptr,"PCOUNT",0,"size of special data area",status);
        ffpkyj(fptr,"GCOUNT",1,"one data group (required keyword)",status);
        local_160 = (ulong)(uint)tfields;
        ffpkyj(fptr,"TFIELDS",local_160,"number of fields in each row",status);
        uVar9 = 0;
        do {
          ppcVar2 = local_178;
          if (uVar9 == local_160) break;
          if (*local_178[uVar9] != '\0') {
            uVar10 = (int)uVar9 + 1;
            snprintf(local_1d8,0x49,"label for field %3d",(ulong)uVar10);
            ffkeyn("TTYPE",uVar10,local_158,status);
            ffpkys(fptr,local_158,ppcVar2[uVar9],local_1d8,status);
          }
          pcVar7 = local_170[uVar9];
          sVar5 = strlen(pcVar7);
          if (0x1d < sVar5) {
            ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
            *status = 0x105;
            break;
          }
          strcpy(local_58,pcVar7);
          ffupch(local_58);
          iVar11 = (int)(uVar9 + 1);
          ffkeyn("TFORM",iVar11,local_158,status);
          uStack_1c8._0_4_ = 0x646c6569;
          uStack_1c8._4_4_ = uStack_1c8._4_4_ & 0xffffff00;
          builtin_strncpy(local_1d8,"data format of f",0x10);
          ffbnfm(local_58,(int *)&local_1dc,&local_188,&local_168,status);
          if (0x28 < (int)local_1dc) {
            if (0x4f < (int)local_1dc) {
              switch(local_1dc) {
              case 0x50:
              case 0x51:
                sVar5 = strlen(local_1d8);
                uVar13._0_1_ = ':';
                uVar13._1_1_ = ' ';
                uVar13._2_1_ = '8';
                uVar13._3_1_ = '-';
                uVar16._0_1_ = 'b';
                uVar16._1_1_ = 'y';
                uVar16._2_1_ = 't';
                uVar16._3_1_ = 'e';
                uVar19._0_1_ = ' ';
                uVar19._1_1_ = 'I';
                uVar19._2_1_ = 'N';
                uVar19._3_1_ = 'T';
                uVar21._0_1_ = 'E';
                uVar21._1_1_ = 'G';
                uVar21._2_1_ = 'E';
                uVar21._3_1_ = 'R';
                break;
              case 0x52:
                sVar5 = strlen(local_1d8);
                uVar14._0_1_ = ':';
                uVar14._1_1_ = ' ';
                uVar14._2_1_ = '8';
                uVar14._3_1_ = '-';
                uVar17._0_1_ = 'b';
                uVar17._1_1_ = 'y';
                uVar17._2_1_ = 't';
                uVar17._3_1_ = 'e';
                uVar20._0_1_ = ' ';
                uVar20._1_1_ = 'D';
                uVar20._2_1_ = 'O';
                uVar20._3_1_ = 'U';
                uVar22._0_1_ = 'B';
                uVar22._1_1_ = 'L';
                uVar22._2_1_ = 'E';
                uVar22._3_1_ = '\0';
                goto LAB_001b2ce0;
              case 0x53:
                sVar5 = strlen(local_1d8);
                builtin_strncpy(local_1d8 + sVar5,": COMPLEX",10);
                goto LAB_001b2885;
              default:
                if (local_1dc != 0xa3) goto switchD_001b2785_caseD_c;
                sVar5 = strlen(local_1d8);
                uVar13._0_1_ = ':';
                uVar13._1_1_ = ' ';
                uVar13._2_1_ = 'D';
                uVar13._3_1_ = 'O';
                uVar16._0_1_ = 'U';
                uVar16._1_1_ = 'B';
                uVar16._2_1_ = 'L';
                uVar16._3_1_ = 'E';
                uVar19._0_1_ = ' ';
                uVar19._1_1_ = 'C';
                uVar19._2_1_ = 'O';
                uVar19._3_1_ = 'M';
                uVar21._0_1_ = 'P';
                uVar21._1_1_ = 'L';
                uVar21._2_1_ = 'E';
                uVar21._3_1_ = 'X';
              }
              goto LAB_001b287b;
            }
            if (local_1dc == 0x29) {
LAB_001b2814:
              sVar5 = strlen(local_1d8);
              uVar13._0_1_ = ':';
              uVar13._1_1_ = ' ';
              uVar13._2_1_ = '4';
              uVar13._3_1_ = '-';
              uVar16._0_1_ = 'b';
              uVar16._1_1_ = 'y';
              uVar16._2_1_ = 't';
              uVar16._3_1_ = 'e';
              uVar19._0_1_ = ' ';
              uVar19._1_1_ = 'I';
              uVar19._2_1_ = 'N';
              uVar19._3_1_ = 'T';
              uVar21._0_1_ = 'E';
              uVar21._1_1_ = 'G';
              uVar21._2_1_ = 'E';
              uVar21._3_1_ = 'R';
              goto LAB_001b287b;
            }
            if (local_1dc != 0x2a) goto switchD_001b2785_caseD_c;
            sVar5 = strlen(local_1d8);
            builtin_strncpy(local_1d8 + sVar5,": 4-byte REAL",0xe);
            goto LAB_001b2885;
          }
          switch(local_1dc) {
          case 0xb:
            sVar5 = strlen(local_1d8);
            builtin_strncpy(local_1d8 + sVar5,": BYTE",7);
            break;
          case 0xc:
          case 0xd:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
switchD_001b2785_caseD_c:
            if ((int)local_1dc < 0) {
              sVar5 = strlen(local_1d8);
              *(undefined8 *)((long)&uStack_1c8 + sVar5) = 0x79617272612068;
              uVar14._0_1_ = ':';
              uVar14._1_1_ = ' ';
              uVar14._2_1_ = 'v';
              uVar14._3_1_ = 'a';
              uVar17._0_1_ = 'r';
              uVar17._1_1_ = 'i';
              uVar17._2_1_ = 'a';
              uVar17._3_1_ = 'b';
              uVar20._0_1_ = 'l';
              uVar20._1_1_ = 'e';
              uVar20._2_1_ = ' ';
              uVar20._3_1_ = 'l';
              uVar22._0_1_ = 'e';
              uVar22._1_1_ = 'n';
              uVar22._2_1_ = 'g';
              uVar22._3_1_ = 't';
LAB_001b2ce0:
              *(undefined4 *)(local_1d8 + sVar5) = uVar14;
              *(undefined4 *)(local_1d8 + sVar5 + 4) = uVar17;
              *(undefined4 *)(local_1d8 + sVar5 + 8) = uVar20;
              *(undefined4 *)(local_1d8 + sVar5 + 0xc) = uVar22;
            }
            break;
          case 0xe:
            sVar5 = strlen(local_1d8);
            uVar13._0_1_ = ':';
            uVar13._1_1_ = ' ';
            uVar13._2_1_ = '1';
            uVar13._3_1_ = '-';
            uVar16._0_1_ = 'b';
            uVar16._1_1_ = 'y';
            uVar16._2_1_ = 't';
            uVar16._3_1_ = 'e';
            uVar19._0_1_ = ' ';
            uVar19._1_1_ = 'L';
            uVar19._2_1_ = 'O';
            uVar19._3_1_ = 'G';
            uVar21._0_1_ = 'I';
            uVar21._1_1_ = 'C';
            uVar21._2_1_ = 'A';
            uVar21._3_1_ = 'L';
            goto LAB_001b287b;
          case 0x10:
            sVar5 = strlen(local_1d8);
            builtin_strncpy(local_1d8 + sVar5,": ASCII Characte",0x10);
            *(undefined2 *)((long)&uStack_1c8 + sVar5) = 0x72;
            pcVar7 = strchr(local_58,0x41);
            iVar3 = __isoc99_sscanf(pcVar7 + 1,"%ld",&local_168);
            if ((iVar3 == 1) && (local_188 < local_168)) {
              if (local_188 == 1) {
                uStack_1b8 = 0x494d2059422058;
                uStack_1b1 = 0x53;
                uStack_1b0 = 0x3f3f454b4154;
                uStack_1c8._0_4_ = 0x49494353;
                uStack_1c8._4_4_ = 0x42415420;
                uStack_1c0 = 0x595320454c;
                uStack_1bb = 0x544e;
                uStack_1b9 = 0x41;
                uVar15._0_1_ = 'E';
                uVar15._1_1_ = 'R';
                uVar15._2_1_ = 'R';
                uVar15._3_1_ = 'O';
                uVar18._0_1_ = 'R';
                uVar18._1_1_ = '?';
                uVar18._2_1_ = '?';
                uVar18._3_1_ = ' ';
                local_1d8[8] = ' ';
                local_1d8[9] = 'U';
                local_1d8[10] = 'S';
                local_1d8[0xb] = 'I';
                local_1d8[0xc] = 'N';
                local_1d8[0xd] = 'G';
                local_1d8[0xe] = ' ';
                local_1d8[0xf] = 'A';
              }
              else {
                uStack_1b8 = 0x4e4d554c4f4320;
                uStack_1b1 = 0x20;
                uStack_1b0 = 0x72204854444957;
                uStack_1a9 = 0;
                uStack_1c8._0_4_ = 0x4e552021;
                uStack_1c8._4_4_ = 0x57205449;
                uStack_1c0 = 0x2048544449;
                uStack_1bb = 0x2077;
                uStack_1b9 = 0x3e;
                uVar15._0_1_ = 'r';
                uVar15._1_1_ = 'A';
                uVar15._2_1_ = 'w';
                uVar15._3_1_ = ' ';
                uVar18._0_1_ = 'F';
                uVar18._1_1_ = 'O';
                uVar18._2_1_ = 'R';
                uVar18._3_1_ = 'M';
                local_1d8[8] = 'A';
                local_1d8[9] = 'T';
                local_1d8[10] = ' ';
                local_1d8[0xb] = 'E';
                local_1d8[0xc] = 'R';
                local_1d8[0xd] = 'R';
                local_1d8[0xe] = 'O';
                local_1d8[0xf] = 'R';
              }
              local_1d8[4] = (char)uVar18;
              local_1d8[5] = SUB41(uVar18,1);
              local_1d8[6] = SUB41(uVar18,2);
              local_1d8[7] = SUB41(uVar18,3);
              local_1d8[0] = (char)uVar15;
              local_1d8[1] = SUB41(uVar15,1);
              local_1d8[2] = SUB41(uVar15,2);
              local_1d8[3] = SUB41(uVar15,3);
            }
            break;
          case 0x14:
          case 0x15:
            sVar5 = strlen(local_1d8);
            uVar13._0_1_ = ':';
            uVar13._1_1_ = ' ';
            uVar13._2_1_ = '2';
            uVar13._3_1_ = '-';
            uVar16._0_1_ = 'b';
            uVar16._1_1_ = 'y';
            uVar16._2_1_ = 't';
            uVar16._3_1_ = 'e';
            uVar19._0_1_ = ' ';
            uVar19._1_1_ = 'I';
            uVar19._2_1_ = 'N';
            uVar19._3_1_ = 'T';
            uVar21._0_1_ = 'E';
            uVar21._1_1_ = 'G';
            uVar21._2_1_ = 'E';
            uVar21._3_1_ = 'R';
LAB_001b287b:
            *(undefined4 *)(local_1d8 + sVar5) = uVar13;
            *(undefined4 *)(local_1d8 + sVar5 + 4) = uVar16;
            *(undefined4 *)(local_1d8 + sVar5 + 8) = uVar19;
            *(undefined4 *)(local_1d8 + sVar5 + 0xc) = uVar21;
            *(undefined1 *)((long)&uStack_1c8 + sVar5) = 0;
            break;
          default:
            if (local_1dc != 1) {
              if (local_1dc == 0x28) goto LAB_001b2814;
              goto switchD_001b2785_caseD_c;
            }
            sVar5 = strlen(local_1d8);
            builtin_strncpy(local_1d8 + sVar5,": BIT",6);
          }
LAB_001b2885:
          uVar10 = -local_1dc;
          if (0 < (int)local_1dc) {
            uVar10 = local_1dc;
          }
          if ((int)uVar10 < 0x28) {
            pcVar7 = local_58;
            if (uVar10 == 0xc) {
              do {
                pcVar6 = pcVar7;
                pcVar7 = pcVar6 + 1;
              } while (*pcVar6 != 'S');
              *pcVar6 = 'B';
              ffpkys(fptr,local_158,local_58,local_1d8,status);
              ffkeyn("TZERO",iVar11,local_158,status);
              uStack_1c8._0_4_ = 0x79622064;
              uStack_1c8._4_4_ = 0x736574;
              builtin_strncpy(local_1d8 + 8,"or signe",8);
              uVar10 = 0xc0600000;
LAB_001b2b5b:
              builtin_strncpy(local_1d8,"offset f",8);
              ffpkyg(fptr,local_158,(double)((ulong)uVar10 << 0x20),0,local_1d8,status);
              ffkeyn("TSCAL",iVar11,local_158,status);
              goto LAB_001b2bae;
            }
            if (uVar10 == 0x14) {
              do {
                pcVar6 = pcVar7;
                pcVar7 = pcVar6 + 1;
              } while (*pcVar6 != 'U');
              *pcVar6 = 'I';
              ffpkys(fptr,local_158,local_58,local_1d8,status);
              ffkeyn("TZERO",iVar11,local_158,status);
              builtin_strncpy(local_1d8 + 8,"or unsig",8);
              uStack_1c8._0_4_ = 0x2064656e;
              uStack_1c8._4_4_ = 0x65746e69;
              uStack_1c0 = 0x73726567;
              uVar10 = 0x40e00000;
              goto LAB_001b2b5b;
            }
LAB_001b2a4b:
            ffpkys(fptr,local_158,local_58,local_1d8,status);
          }
          else {
            pcVar7 = local_58;
            if (uVar10 == 0x28) {
              do {
                pcVar6 = pcVar7;
                pcVar7 = pcVar6 + 1;
              } while (*pcVar6 != 'V');
              *pcVar6 = 'J';
              ffpkys(fptr,local_158,local_58,local_1d8,status);
              ffkeyn("TZERO",iVar11,local_158,status);
              builtin_strncpy(local_1d8 + 8,"or unsig",8);
              uStack_1c8._0_4_ = 0x2064656e;
              uStack_1c8._4_4_ = 0x65746e69;
              uStack_1c0 = 0x73726567;
              uVar10 = 0x41e00000;
              goto LAB_001b2b5b;
            }
            if (uVar10 != 0x50) goto LAB_001b2a4b;
            do {
              pcVar6 = pcVar7;
              pcVar7 = pcVar6 + 1;
            } while (*pcVar6 != 'W');
            *pcVar6 = 'K';
            ffpkys(fptr,local_158,local_58,local_1d8,status);
            ffkeyn("TZERO",iVar11,local_108,status);
            sVar5 = strlen(local_108);
            builtin_strncpy(local_108 + sVar5,"    ",4);
            *(undefined2 *)((long)auStack_104 + sVar5) = 0x20;
            local_100[0] = '\0';
            sVar5 = strlen(local_108);
            *(undefined8 *)((long)auStack_da + sVar5) = 0x7372656765746e;
            builtin_strncpy(local_108 + sVar5,"=  92233",8);
            builtin_strncpy(local_100 + sVar5,"72036854",8);
            builtin_strncpy(acStack_f8 + sVar5,"775808 /",8);
            builtin_strncpy(acStack_f0 + sVar5," offset ",8);
            builtin_strncpy(acStack_e8 + sVar5,"for unsi",8);
            builtin_strncpy(acStack_e0 + sVar5,"gned int",8);
            ffprec(fptr,local_108,status);
            ffkeyn("TSCAL",iVar11,local_158,status);
LAB_001b2bae:
            uStack_1c8._0_4_ = 0x64656c;
            builtin_strncpy(local_1d8,"data are not sca",0x10);
            ffpkyg(fptr,local_158,1.0,0,local_1d8,status);
          }
          if (((local_180 != (char **)0x0) && (local_180[uVar9] != (char *)0x0)) &&
             (*local_180[uVar9] != '\0')) {
            ffkeyn("TUNIT",iVar11,local_158,status);
            ffpkys(fptr,local_158,local_180[uVar9],"physical unit of field",status);
          }
          uVar9 = uVar9 + 1;
        } while (*status < 1);
        if (local_a8[0] != '\0') {
          ffpkys(fptr,"EXTNAME",local_a8,"name of this binary table extension",status);
        }
        if (0 < *status) {
          ffpmsg("Failed to write binary table header keywords (ffphbn)");
        }
        iVar11 = *status;
      }
      else {
        *status = 0xd8;
        iVar11 = 0xd8;
      }
    }
    else {
      *status = 0xc9;
      iVar11 = 0xc9;
    }
  }
  return iVar11;
}

Assistant:

int ffphbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount,     /* I - size of the variable length heap area    */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the Binary Table:
*/
{
    int ii, datatype, iread = 0;
    long repeat, width;
    LONGLONG naxis1;

    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];
    char *cptr, card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (pcount < 0)
        return(*status = BAD_PCOUNT);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);

    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", "BINTABLE", "binary table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit bytes", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional binary table", status);

    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)  /* sum the width of each field */
    {
        ffbnfm(tform[ii], &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
            naxis1 += repeat;   /* one byte per char */
        else if (datatype == TBIT)
            naxis1 += (repeat + 7) / 8;
        else if (datatype > 0)
            naxis1 += repeat * (datatype / 10);
        else if (tform[ii][0] == 'P' || tform[ii][1] == 'P'||
                 tform[ii][0] == 'p' || tform[ii][1] == 'p')
           /* this is a 'P' variable length descriptor (neg. datatype) */
            naxis1 += 8;
        else
           /* this is a 'Q' variable length descriptor (neg. datatype) */
            naxis1 += 16;

        if (*status > 0)
            break;       /* abort loop on error */
    }

    ffpkyj(fptr, "NAXIS1", naxis1, "width of table in bytes", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);

    /*
      the initial value of PCOUNT (= size of the variable length array heap)
      should always be zero.  If any variable length data is written, then
      the value of PCOUNT will be updated when the HDU is closed
    */
    ffpkyj(fptr, "PCOUNT", 0, "size of special data area", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);

        ffkeyn("TFORM", ii + 1, name, status);
        strcpy(comm, "data format of field");

        ffbnfm(tfmt, &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
        {
            strcat(comm, ": ASCII Character");

            /* Do sanity check to see if an ASCII table format was used,  */
            /* e.g., 'A8' instead of '8A', or a bad unit width eg '8A9'.  */
            /* Don't want to return an error status, so write error into  */
            /* the keyword comment.  */

            cptr = strchr(tfmt,'A');
            cptr++;

            if (cptr)
               iread = sscanf(cptr,"%ld", &width);

            if (iread == 1 && (width > repeat)) 
            {
              if (repeat == 1)
                strcpy(comm, "ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              else
                strcpy(comm, "rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
            }
        }
        else if (datatype == TBIT)
           strcat(comm, ": BIT");
        else if (datatype == TBYTE)
           strcat(comm, ": BYTE");
        else if (datatype == TLOGICAL)
           strcat(comm, ": 1-byte LOGICAL");
        else if (datatype == TSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TUSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TLONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TLONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TULONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TULONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TFLOAT)
           strcat(comm, ": 4-byte REAL");
        else if (datatype == TDOUBLE)
           strcat(comm, ": 8-byte DOUBLE");
        else if (datatype == TCOMPLEX)
           strcat(comm, ": COMPLEX");
        else if (datatype == TDBLCOMPLEX)
           strcat(comm, ": DOUBLE COMPLEX");
        else if (datatype < 0)
           strcat(comm, ": variable length array");

        if (abs(datatype) == TSBYTE) /* signed bytes */
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, name, -128., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 32768., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, name, tfmt, comm, status);
        }

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) ) /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii],
             "physical unit of field", status);
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this binary table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write binary table header keywords (ffphbn)");

    return(*status);
}